

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_gen.c
# Opt level: O1

int retrieve_pk(uchar *pk_out,uchar *inv,gf *g,gf *L)

{
  uchar *puVar1;
  long lVar2;
  uint col_00;
  bool bVar3;
  uchar col [768];
  uchar local_338 [776];
  
  col_00 = 0x300;
  do {
    pk_retrieve_8cols(local_338,col_00,inv,g,L);
    puVar1 = pk_out + ((int)(col_00 - 0x300) >> 3);
    lVar2 = 0;
    do {
      *puVar1 = local_338[lVar2];
      lVar2 = lVar2 + 1;
      puVar1 = puVar1 + 0x154;
    } while (lVar2 != 0x300);
    bVar3 = col_00 < 0xd98;
    col_00 = col_00 + 8;
  } while (bVar3);
  return 0;
}

Assistant:

int retrieve_pk(unsigned char *pk_out, unsigned char *inv, gf *g, gf *L)
{
  unsigned char col[SYS_T*GFBITS];

  // skip producing the identity matrix, i.e. the first SYS_T*GFBITS columns
  for(int k = SYS_T*GFBITS; k < SYS_N; k += 8)
  {
    pk_retrieve_8cols(col, k, inv, g, L);

    for(int i = 0; i < SYS_T*GFBITS; i++)
    {
      pk_out[i*PK_ROW_BYTES + (k - SYS_T*GFBITS)/8] = col[i];
    }
  }

  return 0;
}